

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int message_set_properties(MESSAGE_HANDLE message,PROPERTIES_HANDLE properties)

{
  LOGGER_LOG p_Var1;
  PROPERTIES_HANDLE pPVar2;
  LOGGER_LOG l_1;
  PROPERTIES_HANDLE new_properties;
  LOGGER_LOG l;
  int result;
  PROPERTIES_HANDLE properties_local;
  MESSAGE_HANDLE message_local;
  
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_set_properties",0x2d2,1,"NULL message");
    }
    l._4_4_ = 0x2d3;
  }
  else if (properties == (PROPERTIES_HANDLE)0x0) {
    if (message->properties != (PROPERTIES_HANDLE)0x0) {
      properties_destroy(message->properties);
      message->properties = (PROPERTIES_HANDLE)0x0;
    }
    l._4_4_ = 0;
  }
  else {
    pPVar2 = properties_clone(properties);
    if (pPVar2 == (PROPERTIES_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_set_properties",0x2ed,1,"Cannot clone message properties");
      }
      l._4_4_ = 0x2ee;
    }
    else {
      if (message->properties != (PROPERTIES_HANDLE)0x0) {
        properties_destroy(message->properties);
      }
      message->properties = pPVar2;
      l._4_4_ = 0;
    }
  }
  return l._4_4_;
}

Assistant:

int message_set_properties(MESSAGE_HANDLE message, PROPERTIES_HANDLE properties)
{
    int result;

    if (message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_054: [ If `message` is NULL, `message_set_properties` shall fail and return a non-zero value. ]*/
        LogError("NULL message");
        result = MU_FAILURE;
    }
    else
    {
        if (properties == NULL)
        {
            /* Codes_SRS_MESSAGE_01_147: [ If `properties` is NULL, the previously stored message properties associated with `message` shall be freed. ]*/
            if (message->properties != NULL)
            {
                properties_destroy(message->properties);
                message->properties = NULL;
            }

            /* Codes_SRS_MESSAGE_01_053: [ On success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            PROPERTIES_HANDLE new_properties;

            /* Codes_SRS_MESSAGE_01_052: [ `message_set_properties` shall copy the contents of `properties` as the message properties for the message instance identified by `message`. ]*/
            /* Codes_SRS_MESSAGE_01_055: [ Cloning the message properties shall be done by calling `properties_clone`. ]*/
            new_properties = properties_clone(properties);
            if (new_properties == NULL)
            {
                /* Codes_SRS_MESSAGE_01_056: [ If `properties_clone` fails, `message_set_properties` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone message properties");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_063: [ If setting the message properties fails, the previous value shall be preserved. ]*/
                /* Only do the free of the previous value if we could clone the new one*/
                if (message->properties != NULL)
                {
                    properties_destroy(message->properties);
                }

                message->properties = new_properties;

                /* Codes_SRS_MESSAGE_01_053: [ On success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}